

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_ior(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  uint uVar1;
  mp_limb_t *pmVar2;
  mp_limb_t *pmVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  mp_ptr pmVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  __mpz_struct *p_Var13;
  ulong uVar14;
  mp_limb_t mVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  
  uVar1 = u->_mp_size;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar8 = (ulong)uVar5;
  uVar1 = v->_mp_size;
  uVar6 = -uVar1;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  p_Var13 = v;
  uVar21 = (ulong)uVar6;
  if (uVar5 < uVar6) {
    p_Var13 = u;
    uVar21 = uVar8;
    u = v;
    uVar8 = (ulong)uVar6;
  }
  if (uVar21 == 0) {
    mpz_set(r,u);
    return;
  }
  uVar16 = (ulong)((uint)u->_mp_size >> 0x1f);
  uVar1 = p_Var13->_mp_size;
  uVar22 = (ulong)(uVar1 >> 0x1f);
  uVar10 = (ulong)((uVar1 | u->_mp_size) >> 0x1f);
  if ((int)uVar1 < 0) {
    uVar8 = uVar21;
  }
  if ((long)r->_mp_alloc < (long)(uVar10 + uVar8)) {
    pmVar9 = mpz_realloc(r,uVar10 + uVar8);
  }
  else {
    pmVar9 = r->_mp_d;
  }
  uVar11 = -uVar16;
  uVar12 = -uVar22;
  pmVar2 = u->_mp_d;
  pmVar3 = p_Var13->_mp_d;
  uVar17 = 0;
  uVar18 = uVar10;
  do {
    uVar19 = pmVar2[uVar17] ^ uVar11;
    uVar20 = uVar19 + uVar16;
    uVar16 = (ulong)CARRY8(uVar19,uVar16);
    uVar19 = pmVar3[uVar17] ^ uVar12;
    uVar14 = uVar19 + uVar22;
    uVar22 = (ulong)CARRY8(uVar19,uVar22);
    uVar19 = (uVar14 | uVar20) ^ -uVar10;
    mVar15 = uVar19 + uVar18;
    uVar18 = (ulong)CARRY8(uVar19,uVar18);
    pmVar9[uVar17] = mVar15;
    uVar17 = uVar17 + 1;
  } while (uVar21 + (uVar21 == 0) != uVar17);
  for (; uVar17 < uVar8; uVar17 = uVar17 + 1) {
    uVar21 = pmVar2[uVar17] ^ uVar11;
    uVar22 = uVar21 + uVar16;
    uVar16 = (ulong)CARRY8(uVar21,uVar16);
    uVar21 = (uVar22 | uVar12) ^ -uVar10;
    mVar15 = uVar21 + uVar18;
    uVar18 = (ulong)CARRY8(uVar21,uVar18);
    pmVar9[uVar17] = mVar15;
  }
  if (uVar18 == 0) {
    if (uVar8 != 0) {
      do {
        if (pmVar9[uVar8 - 1] != 0) goto LAB_005ed718;
        bVar4 = 1 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar4);
      uVar8 = 0;
    }
  }
  else {
    pmVar9[uVar8] = 1;
    uVar8 = uVar8 + 1;
  }
LAB_005ed718:
  iVar7 = -(int)uVar8;
  if (uVar10 == 0) {
    iVar7 = (int)uVar8;
  }
  r->_mp_size = iVar7;
  return;
}

Assistant:

void
mpz_ior (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, rn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc | vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  /* If the smaller input is negative, by sign extension higher limbs
     don't matter. */
  rn = vx ? vn : un;

  rp = MPZ_REALLOC (r, rn + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = ( (ul | vl) ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < rn; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = ( (ul | vx) ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[rn++] = rc;
  else
    rn = mpn_normalized_size (rp, rn);

  r->_mp_size = rx ? -rn : rn;
}